

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relocations.cpp
# Opt level: O2

void ast::Relocations::print(ostream *os)

{
  long *plVar1;
  iterator __end1;
  char *pcVar2;
  undefined8 *puVar3;
  
  ostream_printf(os,"File       Line Section Offset Pos Mask Type    Addend Symbol\n");
  puVar3 = &list_abi_cxx11_;
  while (puVar3 = (undefined8 *)*puVar3, puVar3 != &list_abi_cxx11_) {
    plVar1 = (long *)puVar3[2];
    pcVar2 = "RELATIVE";
    if ((int)plVar1[4] == 0) {
      pcVar2 = "ABSOLUTE";
    }
    ostream_printf(os,"%-10s %4d %3d %7d %4d  %04x %s %6d %-10s\n",*(undefined8 *)*plVar1,
                   (ulong)*(uint *)((undefined8 *)*plVar1 + 1),(ulong)*(uint *)(plVar1 + 2),
                   (ulong)*(uint *)((long)plVar1 + 0x14),(ulong)*(uint *)(plVar1 + 3),
                   (ulong)(uint)~(-1 << (*(byte *)((long)plVar1 + 0x1c) & 0x1f)),pcVar2,
                   (ulong)*(uint *)(plVar1 + 9),plVar1[5]);
  }
  return;
}

Assistant:

void Relocations::print(ostream & os)
{
	ostream_printf(os, "File       Line Section Offset Pos Mask Type    Addend Symbol\n");
	for (auto reloc: list) {
		ostream_printf(os, "%-10s %4d %3d %7d %4d  %04x %s %6d %-10s\n",
				reloc->location->unit, reloc->location->line,
				reloc->section_index, reloc->section_offset,
				reloc->position, MAKE_MASK(reloc->width, 0),
				reloc->type == Relocation::Relocation_type::ABSOLUTE ? "ABSOLUTE" : "RELATIVE",
				reloc->addend, reloc->symbol.c_str());
	}
}